

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

string * __thiscall
Catch::clara::TextFlow::Column::iterator::addIndentAndSuffix
          (string *__return_storage_ptr__,iterator *this,string *plain)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  size_type *psVar4;
  size_t sVar5;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((this->m_stringIndex != 0 || this->m_pos != 0) ||
     (sVar5 = this->m_column->m_initialIndent, sVar5 == 0xffffffffffffffff)) {
    sVar5 = this->m_column->m_indent;
  }
  local_40[0] = local_30;
  ::std::__cxx11::string::_M_construct((ulong)local_40,(char)sVar5);
  if (this->m_suffix == true) {
    local_60[0] = local_50;
    pcVar1 = (plain->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar1,pcVar1 + plain->_M_string_length);
    ::std::__cxx11::string::append((char *)local_60);
  }
  else {
    local_60[0] = local_50;
    pcVar1 = (plain->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar1,pcVar1 + plain->_M_string_length);
  }
  plVar3 = (long *)::std::__cxx11::string::_M_append((char *)local_40,(ulong)local_60[0]);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar4) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

auto addIndentAndSuffix(std::string const &plain) const -> std::string {
			return std::string(indent(), ' ') + (m_suffix ? plain + "-" : plain);
		}